

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_anchor(yaml_parser_t *parser,yaml_token_type_t type)

{
  size_t *psVar1;
  yaml_token_t **tail;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  byte bVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  yaml_token_t *pyVar11;
  yaml_token_t *pyVar12;
  byte bVar13;
  yaml_mark_t start_mark;
  byte *local_d0;
  byte *local_c8;
  byte *pbStack_c0;
  yaml_token_type_t local_b4;
  yaml_mark_t *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  size_t local_98;
  yaml_token_t local_88;
  
  bVar13 = 0;
  iVar3 = yaml_parser_save_simple_key(parser);
  if (iVar3 != 0) {
    parser->simple_key_allowed = 0;
    local_c8 = (byte *)0x0;
    pbStack_c0 = (byte *)0x0;
    local_d0 = (byte *)yaml_malloc(0x10);
    if (local_d0 == (byte *)0x0) {
LAB_0010fc79:
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      local_c8 = local_d0 + 0x10;
      local_d0[0] = 0;
      local_d0[1] = 0;
      local_d0[2] = 0;
      local_d0[3] = 0;
      local_d0[4] = 0;
      local_d0[5] = 0;
      local_d0[6] = 0;
      local_d0[7] = 0;
      local_d0[8] = 0;
      local_d0[9] = 0;
      local_d0[10] = 0;
      local_d0[0xb] = 0;
      local_d0[0xc] = 0;
      local_d0[0xd] = 0;
      local_d0[0xe] = 0;
      local_d0[0xf] = 0;
      local_98 = (parser->mark).column;
      local_a8 = (undefined4)(parser->mark).index;
      uStack_a4 = *(undefined4 *)((long)&(parser->mark).index + 4);
      uStack_a0 = (undefined4)(parser->mark).line;
      uStack_9c = *(undefined4 *)((long)&(parser->mark).line + 4);
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      pbVar6 = (parser->buffer).pointer;
      sVar5 = parser->unread - 1;
      parser->unread = sVar5;
      bVar7 = *pbVar6;
      lVar10 = 1;
      if ((((char)bVar7 < '\0') && (lVar10 = 2, (bVar7 & 0xe0) != 0xc0)) &&
         (lVar10 = 3, (bVar7 & 0xf0) != 0xe0)) {
        lVar10 = (ulong)((bVar7 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar6 + lVar10;
      pbStack_c0 = local_d0;
      local_b4 = type;
      if ((sVar5 != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0)) {
        local_b0 = &parser->mark;
        iVar3 = 0;
        while( true ) {
          pbVar6 = (parser->buffer).pointer;
          bVar7 = *pbVar6;
          if (((9 < (byte)(bVar7 - 0x30)) && (0x19 < (byte)((bVar7 & 0xdf) + 0xbf))) &&
             ((bVar7 != 0x5f && (bVar7 != 0x2d)))) break;
          if (local_c8 <= pbStack_c0 + 5) {
            iVar4 = yaml_string_extend(&local_d0,&pbStack_c0,&local_c8);
            if (iVar4 == 0) goto LAB_0010fc79;
            pbVar6 = (parser->buffer).pointer;
            bVar7 = *pbVar6;
          }
          if ((char)bVar7 < '\0') {
            if ((bVar7 & 0xe0) == 0xc0) {
LAB_0010fc08:
              (parser->buffer).pointer = pbVar6 + 1;
              *pbStack_c0 = *pbVar6;
              pbVar6 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010fc2c;
            }
            if ((bVar7 & 0xf0) == 0xe0) {
LAB_0010fbe4:
              (parser->buffer).pointer = pbVar6 + 1;
              *pbStack_c0 = *pbVar6;
              pbVar6 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010fc08;
            }
            if ((bVar7 & 0xf8) == 0xf0) {
              (parser->buffer).pointer = pbVar6 + 1;
              *pbStack_c0 = *pbVar6;
              pbVar6 = (parser->buffer).pointer;
              pbStack_c0 = pbStack_c0 + 1;
              goto LAB_0010fbe4;
            }
          }
          else {
LAB_0010fc2c:
            (parser->buffer).pointer = pbVar6 + 1;
            *pbStack_c0 = *pbVar6;
            pbStack_c0 = pbStack_c0 + 1;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          psVar1 = &parser->unread;
          *psVar1 = *psVar1 - 1;
          if ((*psVar1 == 0) && (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 == 0))
          goto LAB_0010fc7f;
          iVar3 = iVar3 + -1;
        }
        if (iVar3 != 0) {
          uVar9 = (uint)bVar7;
          if (uVar9 < 0x3f) {
            if ((bVar7 < 0x3b) && ((0x400102100002601U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) {
LAB_0010fcef:
              local_88.data.tag.suffix = (yaml_char_t *)0x0;
              local_88.data._16_8_ = 0;
              local_88.start_mark.index = CONCAT44(uStack_a4,local_a8);
              local_88.start_mark.line = CONCAT44(uStack_9c,uStack_a0);
              local_88.start_mark.column = local_98;
              local_88.end_mark.index = local_b0->index;
              local_88.end_mark.line = local_b0->line;
              local_88.end_mark.column = local_b0->column;
              local_88._0_8_ = (ulong)(local_b4 == YAML_ANCHOR_TOKEN) | 0x12;
              local_88.data.tag.handle = local_d0;
              tail = &(parser->tokens).tail;
              pyVar12 = (parser->tokens).tail;
              if (pyVar12 == (parser->tokens).end) {
                iVar3 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                          &(parser->tokens).end);
                if (iVar3 == 0) {
                  parser->error = YAML_MEMORY_ERROR;
                  yaml_token_delete(&local_88);
                  return 0;
                }
                pyVar12 = *tail;
              }
              *tail = pyVar12 + 1;
              pyVar11 = &local_88;
              for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar2 = *(undefined4 *)&pyVar11->field_0x4;
                pyVar12->type = pyVar11->type;
                *(undefined4 *)&pyVar12->field_0x4 = uVar2;
                pyVar11 = (yaml_token_t *)((long)pyVar11 + ((ulong)bVar13 * -2 + 1) * 8);
                pyVar12 = (yaml_token_t *)((long)pyVar12 + (ulong)bVar13 * -0x10 + 8);
              }
              return 1;
            }
          }
          else if (((bVar7 - 0x3f < 0x3f) &&
                   ((0x4000000240000003U >> ((ulong)(bVar7 - 0x3f) & 0x3f) & 1) != 0)) ||
                  ((uVar9 != 0xe2 && ((bVar7 == 0xc2 && (pbVar6[1] == 0x85)))))) goto LAB_0010fcef;
        }
        pcVar8 = "while scanning an alias";
        if (local_b4 == YAML_ANCHOR_TOKEN) {
          pcVar8 = "while scanning an anchor";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar8;
        (parser->context_mark).index = CONCAT44(uStack_a4,local_a8);
        (parser->context_mark).line = CONCAT44(uStack_9c,uStack_a0);
        (parser->context_mark).column = local_98;
        parser->problem = "did not find expected alphabetic or numeric character";
        sVar5 = local_b0->line;
        (parser->problem_mark).index = local_b0->index;
        (parser->problem_mark).line = sVar5;
        (parser->problem_mark).column = local_b0->column;
      }
    }
LAB_0010fc7f:
    yaml_free(local_d0);
  }
  return 0;
}

Assistant:

static int
yaml_parser_fetch_anchor(yaml_parser_t *parser, yaml_token_type_t type)
{
    yaml_token_t token;

    /* An anchor or an alias could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow an anchor or an alias. */

    parser->simple_key_allowed = 0;

    /* Create the ALIAS or ANCHOR token and append it to the queue. */

    if (!yaml_parser_scan_anchor(parser, &token, type))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }
    return 1;
}